

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>,_738093167U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>,_738093167U>
           *this)

{
  int local_90;
  result_type local_8c;
  int iterations;
  result_type x;
  uint *p;
  uint local_78 [2];
  uint state [25];
  WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>,_738093167U>
  *this_local;
  
  p._4_4_ = 1;
  unique0x10000090 = this;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_78,0x19,(int *)((long)&p + 4));
  _iterations = local_78;
  Well<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,Detail::M1,Detail::M3<-15>,Detail::M3<10>,Detail::M3<-11>,Detail::M3<16>,Detail::M2<20>,Detail::M1,Detail::M3<-28>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,Detail::M1,Detail::M3<_15>,Detail::M3<10>,Detail::M3<_11>,Detail::M3<16>,Detail::M2<20>,Detail::M1,Detail::M3<_28>,Detail::NoTempering>
              *)this,(uint **)&iterations,state + 0x17);
  local_8c = 0;
  local_90 = 1000000000;
  while (0 < local_90) {
    local_8c = Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>
               ::operator()(&this->rng);
    local_90 = local_90 + -1;
  }
  return local_8c;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }